

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

bool __thiscall CNode::IsOutboundOrBlockRelayConn(CNode *this)

{
  long in_FS_OFFSET;
  
  if (ADDR_FETCH < this->m_conn_type) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                  ,0x301,"bool CNode::IsOutboundOrBlockRelayConn() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)(0x12U >> ((byte)this->m_conn_type & 0x1f) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool IsOutboundOrBlockRelayConn() const {
        switch (m_conn_type) {
            case ConnectionType::OUTBOUND_FULL_RELAY:
            case ConnectionType::BLOCK_RELAY:
                return true;
            case ConnectionType::INBOUND:
            case ConnectionType::MANUAL:
            case ConnectionType::ADDR_FETCH:
            case ConnectionType::FEELER:
                return false;
        } // no default case, so the compiler can warn about missing cases

        assert(false);
    }